

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,VarList *var_list,void *data)

{
  int iVar1;
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> _Var2;
  uint uVar3;
  ulong uVar4;
  ExpVarData_conflict exp_var_data;
  int local_38;
  int local_34;
  
  iVar1 = *data;
  uVar3 = (uint)((ulong)((long)(var_list->var_list_).
                               super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(var_list->var_list_).
                              super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (*(int *)((long)data + 4) - iVar1 == uVar3) {
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        _local_38 = CONCAT44((int)uVar4 + iVar1 + 1,iVar1 + (int)uVar4);
        _Var2._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
             (var_list->var_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t;
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                              .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10)
        )(_Var2._M_t.
          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,this,&local_38);
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
    return;
  }
  __assert_fail("end_register - register_id == var_count",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x4b1,"virtual void luna::CodeGenerateVisitor::Visit(VarList *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(VarList *var_list, void *data)
    {
        auto var_list_data = static_cast<VarListData *>(data);
        int register_id = var_list_data->start_register_;
        int end_register = var_list_data->end_register_;
        int var_count = var_list->var_list_.size();
        assert(end_register - register_id == var_count);

        // Assign results to each variable
        for (int i = 0; i < var_count; ++i, ++register_id)
        {
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            var_list->var_list_[i]->Accept(this, &exp_var_data);
        }
    }